

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O2

int sockopt_callback(void *clientp,curl_socket_t curlfd,curlsocktype purpose)

{
  uint uVar1;
  GlobalConfig *pGVar2;
  undefined8 uVar3;
  sa_family_t sVar4;
  int iVar5;
  undefined4 uVar6;
  uint *puVar7;
  char *pcVar8;
  int __level;
  int tos;
  sockaddr addr;
  curl_socklen_t addrlen;
  
  if (purpose != CURLSOCKTYPE_IPCXN) {
    return 0;
  }
  if (0 < *(long *)((long)clientp + 0x418)) {
    tos = (int)*(long *)((long)clientp + 0x418);
    addrlen = 0x10;
    addr.sa_family = 0;
    addr.sa_data[0] = '\0';
    addr.sa_data[1] = '\0';
    addr.sa_data[2] = '\0';
    addr.sa_data[3] = '\0';
    addr.sa_data[4] = '\0';
    addr.sa_data[5] = '\0';
    addr.sa_data[6] = '\0';
    addr.sa_data[7] = '\0';
    addr.sa_data[8] = '\0';
    addr.sa_data[9] = '\0';
    addr.sa_data[10] = '\0';
    addr.sa_data[0xb] = '\0';
    addr.sa_data[0xc] = '\0';
    addr.sa_data[0xd] = '\0';
    iVar5 = getsockname(curlfd,(sockaddr *)&addr,&addrlen);
    if (iVar5 == 0) {
      sVar4 = addr.sa_family;
    }
    else {
      sVar4 = 0;
    }
    if (sVar4 == 10) {
      __level = 0x29;
      iVar5 = 0x43;
    }
    else {
      if (sVar4 != 2) goto LAB_001199ef;
      iVar5 = 1;
      __level = 0;
    }
    iVar5 = setsockopt(curlfd,__level,iVar5,&tos,4);
    if (iVar5 < 0) {
      puVar7 = (uint *)__errno_location();
      iVar5 = tos;
      uVar1 = *puVar7;
      pGVar2 = *(GlobalConfig **)((long)clientp + 0x3b0);
      pcVar8 = strerror(uVar1);
      warnf(pGVar2,"Setting type of service to %d failed with errno %d: %s;\n",(ulong)(uint)iVar5,
            (ulong)uVar1,pcVar8);
    }
  }
LAB_001199ef:
  if (0 < *(long *)((long)clientp + 0x420)) {
    uVar6 = (undefined4)*(long *)((long)clientp + 0x420);
    addr.sa_family = (short)uVar6;
    addr.sa_data[0] = (char)((uint)uVar6 >> 0x10);
    addr.sa_data[1] = (char)((uint)uVar6 >> 0x18);
    iVar5 = setsockopt(curlfd,1,0xc,&addr,4);
    if (iVar5 != 0) {
      puVar7 = (uint *)__errno_location();
      uVar3 = addr._0_8_;
      uVar1 = *puVar7;
      pGVar2 = *(GlobalConfig **)((long)clientp + 0x3b0);
      pcVar8 = strerror(uVar1);
      warnf(pGVar2,"VLAN priority %d failed with errno %d: %s;\n",uVar3 & 0xffffffff,(ulong)uVar1,
            pcVar8);
    }
  }
  return 0;
}

Assistant:

static int sockopt_callback(void *clientp, curl_socket_t curlfd,
                            curlsocktype purpose)
{
  struct OperationConfig *config = (struct OperationConfig *)clientp;
  if(purpose != CURLSOCKTYPE_IPCXN)
    return CURL_SOCKOPT_OK;
  (void)config;
  (void)curlfd;
#if defined(IP_TOS) || defined(IPV6_TCLASS)
  if(config->ip_tos > 0) {
    int tos = (int)config->ip_tos;
    int result = 0;
    switch(get_address_family(curlfd)) {
    case AF_INET:
#ifdef IP_TOS
      result = setsockopt(curlfd, SOL_IP, IP_TOS, (void *)&tos, sizeof(tos));
#endif
      break;
#if defined(IPV6_TCLASS) && defined(AF_INET6)
    case AF_INET6:
      result = setsockopt(curlfd, IPPROTO_IPV6, IPV6_TCLASS,
                          (void *)&tos, sizeof(tos));
      break;
#endif
    }
    if(result < 0) {
      int error = errno;
      warnf(config->global,
            "Setting type of service to %d failed with errno %d: %s;\n",
            tos, error, strerror(error));
    }
  }
#endif
#ifdef SO_PRIORITY
  if(config->vlan_priority > 0) {
    int priority = (int)config->vlan_priority;
    if(setsockopt(curlfd, SOL_SOCKET, SO_PRIORITY,
      (void *)&priority, sizeof(priority)) != 0) {
      int error = errno;
      warnf(config->global, "VLAN priority %d failed with errno %d: %s;\n",
            priority, error, strerror(error));
    }
  }
#endif
  return CURL_SOCKOPT_OK;
}